

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getLockingMode(char *z)

{
  char *pcVar1;
  byte bVar2;
  byte *pbVar3;
  
  if (z != (char *)0x0) {
    bVar2 = *z;
    if (bVar2 == 0) {
      pcVar1 = "exclusive";
    }
    else {
      pbVar3 = (byte *)(z + 1);
      pcVar1 = "exclusive";
      do {
        if (""[bVar2] != ""[(byte)*pcVar1]) break;
        pcVar1 = (char *)((byte *)pcVar1 + 1);
        bVar2 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      } while (bVar2 != 0);
    }
    if (""[bVar2] == ""[(byte)*pcVar1]) {
      return 1;
    }
    bVar2 = *z;
    if (bVar2 == 0) {
      pcVar1 = "normal";
    }
    else {
      pbVar3 = (byte *)(z + 1);
      pcVar1 = "normal";
      do {
        if (""[bVar2] != ""[(byte)*pcVar1]) break;
        pcVar1 = (char *)((byte *)pcVar1 + 1);
        bVar2 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      } while (bVar2 != 0);
    }
    if (""[bVar2] == ""[(byte)*pcVar1]) {
      return 0;
    }
  }
  return -1;
}

Assistant:

static int getLockingMode(const char *z){
  if( z ){
    if( 0==sqlite3StrICmp(z, "exclusive") ) return PAGER_LOCKINGMODE_EXCLUSIVE;
    if( 0==sqlite3StrICmp(z, "normal") ) return PAGER_LOCKINGMODE_NORMAL;
  }
  return PAGER_LOCKINGMODE_QUERY;
}